

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

bool sb_switch_reserved_blocks(filemgr *file)

{
  uint uVar1;
  superblock *psVar2;
  sb_rsv_bmp *psVar3;
  uint8_t *__ptr;
  uint64_t uVar4;
  void *pvVar5;
  docio_object *pdVar6;
  bid_t bVar7;
  bool bVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  
  psVar2 = file->sb;
  psVar3 = psVar2->rsv_bmp;
  bVar8 = false;
  if (psVar3 != (sb_rsv_bmp *)0x0) {
    LOCK();
    bVar11 = (psVar3->status).super___atomic_base<unsigned_int>._M_i == 0xffff;
    if (bVar11) {
      (psVar3->status).super___atomic_base<unsigned_int>._M_i = 0;
    }
    UNLOCK();
    bVar8 = false;
    if (bVar11) {
      if (psVar2->bmp_doc_offset != (bid_t *)0x0) {
        if (psVar2->num_bmp_docs != 0) {
          lVar10 = 1;
          uVar9 = 0;
          do {
            uVar1 = *(uint *)((long)psVar2->bmp_docs + lVar10 * 8 + -8);
            filemgr_mark_stale(file,psVar2->bmp_doc_offset[uVar9],
                               (ulong)((uVar1 & 0xffff) + (uVar1 >> 0x10) +
                                      *(int *)(&(psVar2->bmp_docs->length).keylen + lVar10 * 4)) +
                               0x20);
            uVar9 = uVar9 + 1;
            lVar10 = lVar10 + 7;
          } while (uVar9 < psVar2->num_bmp_docs);
        }
        free(psVar2->bmp_doc_offset);
        free(psVar2->bmp_docs);
        psVar2->bmp_doc_offset = (bid_t *)0x0;
        psVar2->bmp_docs = (docio_object *)0x0;
      }
      filemgr_sync(file,false,(err_log_callback *)0x0);
      _free_bmp_idx(&psVar2->bmp_idx);
      pthread_spin_lock(&psVar2->bmp_lock);
      LOCK();
      (psVar2->bmp_wcount).super___atomic_base<unsigned_long>._M_i =
           (psVar2->bmp_wcount).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      do {
      } while ((psVar2->bmp_rcount).super___atomic_base<unsigned_long>._M_i != 0);
      __ptr = psVar2->bmp_prev;
      psVar2->bmp_prev = (psVar2->bmp)._M_b._M_p;
      psVar2->bmp_prev_size = (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i;
      LOCK();
      (psVar2->bmp_revnum).super___atomic_base<unsigned_long>._M_i = psVar3->bmp_revnum;
      UNLOCK();
      LOCK();
      (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i = psVar3->bmp_size;
      UNLOCK();
      LOCK();
      (psVar2->bmp)._M_b._M_p = psVar3->bmp;
      UNLOCK();
      pvVar5 = (psVar3->bmp_idx).aux;
      (psVar2->bmp_idx).root = (psVar3->bmp_idx).root;
      (psVar2->bmp_idx).aux = pvVar5;
      pdVar6 = psVar3->bmp_docs;
      psVar2->bmp_doc_offset = psVar3->bmp_doc_offset;
      psVar2->bmp_docs = pdVar6;
      psVar2->num_bmp_docs = psVar3->num_bmp_docs;
      uVar4 = psVar3->num_free_blocks;
      psVar2->num_init_free_blocks = uVar4;
      psVar2->num_free_blocks = uVar4;
      LOCK();
      (psVar2->cur_alloc_bid).super___atomic_base<unsigned_long>._M_i = psVar3->cur_alloc_bid;
      UNLOCK();
      bVar7 = psVar3->min_live_hdr_bid;
      psVar2->min_live_hdr_revnum = psVar3->min_live_hdr_revnum;
      psVar2->min_live_hdr_bid = bVar7;
      LOCK();
      (psVar2->bmp_wcount).super___atomic_base<unsigned_long>._M_i =
           (psVar2->bmp_wcount).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      pthread_spin_unlock(&psVar2->bmp_lock);
      free(__ptr);
      free(psVar2->rsv_bmp);
      psVar2->rsv_bmp = (sb_rsv_bmp *)0x0;
      bVar8 = true;
    }
  }
  return bVar8;
}

Assistant:

bool sb_switch_reserved_blocks(struct filemgr *file)
{
    size_t i;
    struct superblock *sb = file->sb;
    struct sb_rsv_bmp *rsv = sb->rsv_bmp;

    // reserved block should exist
    if (!rsv) {
        return false;
    }
    // should be in a normal status
    if (!atomic_cas_uint32_t(&rsv->status, SB_RSV_READY, SB_RSV_VOID)) {
        return false;
    }
    // now status becomes 'VOID' so that rsv_bmp is not available.

    // mark stale previous system docs
    if (sb->bmp_doc_offset) {
        for (i=0; i<sb->num_bmp_docs; ++i) {
            filemgr_mark_stale(file, sb->bmp_doc_offset[i],
                _fdb_get_docsize(sb->bmp_docs[i].length));
        }

        free(sb->bmp_doc_offset);
        free(sb->bmp_docs);
        sb->bmp_doc_offset = NULL;
        sb->bmp_docs = NULL;
    }

    // should flush all dirty blocks in cache
    filemgr_sync(file, false, NULL);

    // free current bitmap idx
    _free_bmp_idx(&sb->bmp_idx);

    // temporarily keep current bitmap
    sb_bmp_change_begin(sb);
    uint8_t *old_prev_bmp = NULL;
    if (sb->bmp_prev) {
        old_prev_bmp = sb->bmp_prev;
    }
    sb->bmp_prev = sb->bmp;
    sb->bmp_prev_size = atomic_get_uint64_t(&sb->bmp_size);

    // copy all pointers from rsv to sb
    atomic_store(&sb->bmp_revnum, rsv->bmp_revnum);
    atomic_store_uint64_t(&sb->bmp_size, rsv->bmp_size);
    sb->bmp = rsv->bmp;
    sb->bmp_idx = rsv->bmp_idx;
    sb->bmp_doc_offset = rsv->bmp_doc_offset;
    sb->bmp_docs = rsv->bmp_docs;
    sb->num_bmp_docs = rsv->num_bmp_docs;
    sb->num_free_blocks = sb->num_init_free_blocks = rsv->num_free_blocks;
    atomic_store_uint64_t(&sb->cur_alloc_bid, rsv->cur_alloc_bid);
    sb->min_live_hdr_revnum = rsv->min_live_hdr_revnum;
    sb->min_live_hdr_bid = rsv->min_live_hdr_bid;
    sb_bmp_change_end(sb);

    free(old_prev_bmp);
    free(sb->rsv_bmp);
    sb->rsv_bmp = NULL;

    return true;
}